

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O1

void finish(nn *n)

{
  if (n->squared_loss != (loss_function *)0x0) {
    (*n->squared_loss->_vptr_loss_function[9])();
  }
  free(n->hidden_units);
  free(n->dropped_out);
  free(n->hidden_units_pred);
  free(n->hiddenbias_pred);
  VW::dealloc_example((_func_void_void_ptr *)0x0,&n->output_layer,(_func_void_void_ptr *)0x0);
  VW::dealloc_example((_func_void_void_ptr *)0x0,&n->hiddenbias,(_func_void_void_ptr *)0x0);
  VW::dealloc_example((_func_void_void_ptr *)0x0,&n->outputweight,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

void finish(nn& n)
{
  delete n.squared_loss;
  free(n.hidden_units);
  free(n.dropped_out);
  free(n.hidden_units_pred);
  free(n.hiddenbias_pred);
  VW::dealloc_example(nullptr, n.output_layer);
  VW::dealloc_example(nullptr, n.hiddenbias);
  VW::dealloc_example(nullptr, n.outputweight);
}